

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

CommandLineFlagParser * __thiscall
google::(anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
          (CommandLineFlagParser *this,CommandLineFlag *flag,char *value,FlagSettingMode set_mode)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  mapped_type *this_00;
  undefined4 in_register_0000000c;
  FlagSettingMode in_R8D;
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [39];
  allocator local_81;
  string local_80 [48];
  string local_50 [8];
  string msg;
  FlagSettingMode set_mode_local;
  char *value_local;
  CommandLineFlag *flag_local;
  CommandLineFlagParser *this_local;
  
  std::__cxx11::string::string(local_50);
  if (((char *)CONCAT44(in_register_0000000c,set_mode) == (char *)0x0) ||
     (bVar1 = anon_unknown_1::FlagRegistry::SetFlagLocked
                        ((FlagRegistry *)flag->name_,(CommandLineFlag *)value,
                         (char *)CONCAT44(in_register_0000000c,set_mode),in_R8D,(string *)local_50),
     bVar1)) {
    pcVar3 = anon_unknown_1::CommandLineFlag::name((CommandLineFlag *)value);
    iVar2 = strcmp(pcVar3,"flagfile");
    if (iVar2 == 0) {
      anon_unknown_1::CommandLineFlagParser::ProcessFlagfileLocked
                ((CommandLineFlagParser *)local_a8,(string *)flag,
                 (FlagSettingMode)fLS::FLAGS_flagfile_abi_cxx11_);
      std::__cxx11::string::operator+=(local_50,(string *)local_a8);
      std::__cxx11::string::~string((string *)local_a8);
    }
    else {
      pcVar3 = anon_unknown_1::CommandLineFlag::name((CommandLineFlag *)value);
      iVar2 = strcmp(pcVar3,"fromenv");
      if (iVar2 == 0) {
        anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
                  ((CommandLineFlagParser *)local_c8,(string *)flag,
                   (FlagSettingMode)fLS::FLAGS_fromenv_abi_cxx11_,SUB41(in_R8D,0));
        std::__cxx11::string::operator+=(local_50,(string *)local_c8);
        std::__cxx11::string::~string((string *)local_c8);
      }
      else {
        pcVar3 = anon_unknown_1::CommandLineFlag::name((CommandLineFlag *)value);
        iVar2 = strcmp(pcVar3,"tryfromenv");
        if (iVar2 == 0) {
          anon_unknown_1::CommandLineFlagParser::ProcessFromenvLocked
                    ((CommandLineFlagParser *)local_e8,(string *)flag,
                     (FlagSettingMode)fLS::FLAGS_tryfromenv_abi_cxx11_,SUB41(in_R8D,0));
          std::__cxx11::string::operator+=(local_50,(string *)local_e8);
          std::__cxx11::string::~string((string *)local_e8);
        }
      }
    }
    std::__cxx11::string::string((string *)this,local_50);
  }
  else {
    pcVar3 = anon_unknown_1::CommandLineFlag::name((CommandLineFlag *)value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar3,&local_81);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&flag->help_,(key_type *)local_80);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",(allocator *)(local_a8 + 0x26));
    std::allocator<char>::~allocator((allocator<char> *)(local_a8 + 0x26));
  }
  local_a8._32_4_ = _S_black;
  std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CommandLineFlagParser::ProcessSingleOptionLocked(
    CommandLineFlag* flag, const char* value, FlagSettingMode set_mode) {
  string msg;
  if (value && !registry_->SetFlagLocked(flag, value, set_mode, &msg)) {
    error_flags_[flag->name()] = msg;
    return "";
  }

  // The recursive flags, --flagfile and --fromenv and --tryfromenv,
  // must be dealt with as soon as they're seen.  They will emit
  // messages of their own.
  if (strcmp(flag->name(), "flagfile") == 0) {
    msg += ProcessFlagfileLocked(FLAGS_flagfile, set_mode);

  } else if (strcmp(flag->name(), "fromenv") == 0) {
    // last arg indicates envval-not-found is fatal (unlike in --tryfromenv)
    msg += ProcessFromenvLocked(FLAGS_fromenv, set_mode, true);

  } else if (strcmp(flag->name(), "tryfromenv") == 0) {
    msg += ProcessFromenvLocked(FLAGS_tryfromenv, set_mode, false);
  }

  return msg;
}